

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O3

bool EndsWith(string *s,string *suffix)

{
  int iVar1;
  bool bVar2;
  undefined1 *local_38;
  size_t local_30;
  undefined1 local_28 [16];
  
  if (s->_M_string_length < suffix->_M_string_length) {
    bVar2 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_38,(ulong)s);
    if (local_30 == suffix->_M_string_length) {
      if (local_30 == 0) {
        bVar2 = true;
      }
      else {
        iVar1 = bcmp(local_38,(suffix->_M_dataplus)._M_p,local_30);
        bVar2 = iVar1 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
  }
  return bVar2;
}

Assistant:

static bool EndsWith(const string& s, const string& suffix) {
  return (s.length() >= suffix.length() &&
          s.substr(s.length() - suffix.length()) == suffix);
}